

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int main(void)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  cJSON *pcVar4;
  undefined8 uVar5;
  long lVar6;
  long in_FS_OFFSET;
  int ids [4];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  char *strings [7];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = cJSON_Version();
  printf("Version: %s\n",uVar3);
  strings[6] = "Saturday";
  strings[4] = "Thursday";
  strings[5] = "Friday";
  strings[2] = "Tuesday";
  strings[3] = "Wednesday";
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0xffffffff00000000;
  strings[0] = "Sunday";
  strings[1] = "Monday";
  local_88 = 1;
  uStack_a0 = 0x100000000;
  ids[0] = 0x74;
  ids[1] = 0x3af;
  ids[2] = 0xea;
  ids[3] = 0x9789;
  pcVar4 = (cJSON *)cJSON_CreateObject();
  uVar3 = cJSON_CreateString("Jack (\"Bee\") Nimble");
  cJSON_AddItemToObject(pcVar4,"name",uVar3);
  uVar3 = cJSON_CreateObject();
  cJSON_AddItemToObject(pcVar4,"format",uVar3);
  cJSON_AddStringToObject(uVar3,"type","rect");
  cJSON_AddNumberToObject(0,uVar3,"width");
  cJSON_AddNumberToObject(0,uVar3,"height");
  cJSON_AddFalseToObject(uVar3,"interlace");
  cJSON_AddNumberToObject(0,uVar3,"frame rate");
  iVar2 = print_preallocated(pcVar4);
  cJSON_Delete(pcVar4);
  if (iVar2 == 0) {
    pcVar4 = (cJSON *)cJSON_CreateStringArray(strings,7);
    iVar2 = print_preallocated(pcVar4);
    cJSON_Delete(pcVar4);
    if (iVar2 == 0) {
      pcVar4 = (cJSON *)cJSON_CreateArray();
      for (lVar6 = 0; lVar6 != 0x24; lVar6 = lVar6 + 0xc) {
        uVar3 = cJSON_CreateIntArray((long)&local_a8 + lVar6,3);
        cJSON_AddItemToArray(pcVar4,uVar3);
      }
      iVar2 = print_preallocated(pcVar4);
      cJSON_Delete(pcVar4);
      if (iVar2 == 0) {
        pcVar4 = (cJSON *)cJSON_CreateObject();
        uVar3 = cJSON_CreateObject();
        cJSON_AddItemToObject(pcVar4,"Image",uVar3);
        cJSON_AddNumberToObject(0,uVar3,"Width");
        cJSON_AddNumberToObject(0,uVar3,"Height");
        cJSON_AddStringToObject(uVar3,"Title","View from 15th Floor");
        uVar5 = cJSON_CreateObject();
        cJSON_AddItemToObject(uVar3,"Thumbnail",uVar5);
        cJSON_AddStringToObject(uVar5,"Url","http:/*www.example.com/image/481989943");
        cJSON_AddNumberToObject(0,uVar5,"Height");
        cJSON_AddStringToObject(uVar5,"Width","100");
        uVar5 = cJSON_CreateIntArray(ids,4);
        cJSON_AddItemToObject(uVar3,"IDs",uVar5);
        iVar2 = print_preallocated(pcVar4);
        cJSON_Delete(pcVar4);
        if (iVar2 == 0) {
          pcVar4 = (cJSON *)cJSON_CreateArray();
          for (lVar6 = 0; lVar6 != 0x80; lVar6 = lVar6 + 0x40) {
            uVar5 = cJSON_CreateObject();
            cJSON_AddItemToArray(pcVar4,uVar5);
            cJSON_AddStringToObject(uVar5,"precision","zip");
            uVar3 = *(undefined8 *)((long)&DAT_00103d50 + lVar6);
            cJSON_AddNumberToObject
                      ((int)*(undefined8 *)((long)&DAT_00103d48 + lVar6),uVar5,"Latitude");
            cJSON_AddNumberToObject((int)uVar3,uVar5,"Longitude");
            cJSON_AddStringToObject(uVar5,"Address","");
            cJSON_AddStringToObject
                      (uVar5,"City",*(undefined8 *)((long)&PTR_anon_var_dwarf_f1_00103d60 + lVar6));
            cJSON_AddStringToObject(uVar5,"State","CA");
            cJSON_AddStringToObject
                      (uVar5,"Zip",*(undefined8 *)((long)&PTR_anon_var_dwarf_11d_00103d70 + lVar6));
            cJSON_AddStringToObject(uVar5,"Country","US");
          }
          iVar2 = print_preallocated(pcVar4);
          cJSON_Delete(pcVar4);
          if (iVar2 == 0) {
            pcVar4 = (cJSON *)cJSON_CreateObject();
            cJSON_AddNumberToObject(0,pcVar4,"number");
            iVar2 = print_preallocated(pcVar4);
            cJSON_Delete(pcVar4);
            if (iVar2 == 0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                return 0;
              }
              __stack_chk_fail();
            }
          }
        }
      }
    }
  }
  exit(1);
}

Assistant:

main(void)
{
    /* print the version */
    printf("Version: %s\n", cJSON_Version());

    /* Now some samplecode for building objects concisely: */
    create_objects();

    return 0;
}